

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

void __thiscall
Potassco::AspifTextOutput::output(AspifTextOutput *this,StringSpan *str,LitSpan *cond)

{
  Atom_t AVar1;
  char *pcVar2;
  ulong uVar3;
  Atom_t atom;
  bool bVar4;
  int iVar5;
  Id_t x;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  size_t ep;
  string name;
  
  if (cond->size == 1) {
    pcVar2 = str->first;
    uVar3 = str->size;
    uVar6 = uVar3;
    pcVar7 = pcVar2;
    if ((1 < uVar3) && (*pcVar2 == '-')) {
      pcVar7 = pcVar2 + 1;
      uVar6 = uVar3 - 1;
    }
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      if ((byte)pcVar7[uVar8] != 0x5f) {
        iVar5 = islower((uint)(byte)pcVar7[uVar8]);
        if (iVar5 != 0) {
          name._M_dataplus._M_p = (pointer)&name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&name,pcVar2,pcVar2 + uVar3);
          iVar5 = Data::atomArity(&name,&ep);
          if ((iVar5 == 0) && (ep < name._M_string_length)) {
            std::__cxx11::string::resize((ulong)&name);
          }
          AVar1 = *cond->first;
          atom = -AVar1;
          if (0 < (int)AVar1) {
            atom = AVar1;
          }
          bVar4 = assignAtomName(this,atom,&name);
          std::__cxx11::string::~string((string *)&name);
          if (bVar4) {
            return;
          }
        }
        break;
      }
    }
  }
  push(this,4);
  x = Data::addOutputString(this->data_,str);
  push(this,x);
  push(this,cond);
  return;
}

Assistant:

void AspifTextOutput::output(const StringSpan& str, const LitSpan& cond) {
	if (size(cond) == 1 && isAtom(str)) {
		std::string name(begin(str), end(str));
		std::size_t ep;
		if (Data::atomArity(name, &ep) == 0 && ep < name.size()) {
			name.resize(ep);
		}
		if (assignAtomName(atom(*begin(cond)), name))
			return;
	}
	push(Directive_t::Output).push(data_->addOutputString(str)).push(cond);
}